

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

int * int_list_dup(int *aa)

{
  int *piVar1;
  int *bb;
  int *b;
  int *a;
  int *aa_local;
  
  for (b = aa; *b != -1; b = b + 1) {
  }
  piVar1 = (int *)malloc((((long)b - (long)aa >> 2) + 1) * 4);
  bb = piVar1;
  b = aa;
  while (*b != -1) {
    *bb = *b;
    bb = bb + 1;
    b = b + 1;
  }
  *bb = -1;
  return piVar1;
}

Assistant:

int *int_list_dup(int *aa) {
  int *a = aa, *b, *bb;
  while (*a != -1) {
    a++;
  }
  bb = b = (int *)MALLOC((a - aa + 1) * sizeof(int));
  a = aa;
  while (*a != -1) {
    *b++ = *a++;
  }
  *b++ = -1;
  return bb;
}